

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_GenFree(DdGen *gen)

{
  int *piVar1;
  DdNode **__ptr;
  
  if (gen != (DdGen *)0x0) {
    switch(gen->type) {
    case 0:
    case 3:
      piVar1 = (gen->gen).cubes.cube;
      if (piVar1 != (int *)0x0) {
        free(piVar1);
        (gen->gen).cubes.cube = (int *)0x0;
      }
    case 2:
      __ptr = (gen->stack).stack;
      if (__ptr != (DdNode **)0x0) {
        free(__ptr);
        (gen->stack).stack = (DdNode **)0x0;
      }
      break;
    case 1:
      piVar1 = (gen->gen).cubes.cube;
      if (piVar1 != (int *)0x0) {
        free(piVar1);
        (gen->gen).cubes.cube = (int *)0x0;
      }
      Cudd_RecursiveDeref(gen->manager,gen->node);
      break;
    default:
      goto switchD_0079d0c9_default;
    }
    free(gen);
  }
switchD_0079d0c9_default:
  return 0;
}

Assistant:

int
Cudd_GenFree(
  DdGen * gen)
{
    if (gen == NULL) return(0);
    switch (gen->type) {
    case CUDD_GEN_CUBES:
    case CUDD_GEN_ZDD_PATHS:
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen->stack.stack);
        break;
    case CUDD_GEN_PRIMES:
        ABC_FREE(gen->gen.primes.cube);
        Cudd_RecursiveDeref(gen->manager,gen->node);
        break;
    case CUDD_GEN_NODES:
        ABC_FREE(gen->stack.stack);
        break;
    default:
        return(0);
    }
    ABC_FREE(gen);
    return(0);

}